

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopStatementSyntax,slang::syntax::LoopStatementSyntax_const&>
          (BumpAllocator *this,LoopStatementSyntax *args)

{
  LoopStatementSyntax *pLVar1;
  LoopStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pLVar1 = (LoopStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::LoopStatementSyntax::LoopStatementSyntax(in_RSI,pLVar1);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }